

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_cohomology_unit_test.cpp
# Opt level: O3

void __thiscall
persistent_cohomology_single_field_coeff_limit::test_method
          (persistent_cohomology_single_field_coeff_limit *this)

{
  shared_count asStack_d0 [7];
  char *local_98;
  char *local_90;
  undefined **local_88;
  undefined1 local_80;
  undefined8 *local_78;
  char *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  char *local_58;
  char *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  char *local_38;
  char *local_30;
  
  local_38 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_30 = "";
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  local_40 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_38,0xa3);
  test_persistence_with_coeff_field(0xb50d);
  local_58 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_50 = "";
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  local_60 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_58,0xa3);
  asStack_d0[0].pi_ = (sp_counted_base *)0x0;
  local_80 = 0;
  local_88 = &PTR__lazy_ostream_00124b78;
  local_78 = &boost::unit_test::lazy_ostream::inst;
  local_70 = "exception std::invalid_argument expected but not raised";
  local_98 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistent_cohomology/test/persistent_cohomology_unit_test.cpp"
  ;
  local_90 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(asStack_d0);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( persistent_cohomology_single_field_coeff_limit )
{
  BOOST_CHECK_THROW(test_persistence_with_coeff_field(46349), std::invalid_argument);
}